

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

float rsg::ConstructorOp::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  int iVar1;
  int iVar2;
  float fVar3;
  
  if ((valueRange.m_type)->m_baseType - TYPE_FLOAT < 3) {
    iVar1 = state->m_expressionDepth;
    iVar2 = getTypeConstructorDepth(valueRange.m_type);
    fVar3 = 0.0;
    if (iVar2 + iVar1 <= state->m_shaderParams->maxExpressionDepth) {
      fVar3 = 1.0;
    }
  }
  else if ((valueRange.m_type)->m_baseType == TYPE_VOID) {
    fVar3 = 0.05;
  }
  else {
    fVar3 = 0.0;
  }
  return fVar3;
}

Assistant:

float ConstructorOp::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (valueRange.getType().isVoid())
		return unusedValueWeight;

	if (!valueRange.getType().isFloatOrVec() && !valueRange.getType().isIntOrVec() && !valueRange.getType().isBoolOrVec())
		return 0.0f;

	if (state.getExpressionDepth() + getTypeConstructorDepth(valueRange.getType()) > state.getShaderParameters().maxExpressionDepth)
		return 0.0f;

	return 1.0f;
}